

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IDisk.cpp
# Opt level: O2

int __thiscall IDisk::CompareToDisk(IDisk *this,IDisk *other_disk,bool exact)

{
  Side *pSVar1;
  uint uVar2;
  void *__s1;
  int iVar3;
  void *pvVar4;
  uint uVar5;
  uint *puVar6;
  MFMTrack *track2;
  long lVar7;
  ulong uVar8;
  MFMTrack *pMVar9;
  ulong uVar10;
  Side *pSVar11;
  uint uVar12;
  char str [1024];
  
  uVar5 = (uint)other_disk->nb_sides_;
  if (other_disk->nb_sides_ < (byte)*(uint *)&this->nb_sides_) {
    uVar5 = *(uint *)&this->nb_sides_;
  }
  uVar10 = 0;
  iVar3 = 0;
  do {
    if (iVar3 != 0) {
      return iVar3;
    }
    if ((uVar5 & 0xff) <= uVar10) {
      return 0;
    }
    puVar6 = &other_disk->side_[uVar10].nb_tracks;
    uVar2 = this->side_[uVar10].nb_tracks;
    if (exact) {
      uVar12 = uVar2;
      if (uVar2 != *puVar6) {
        return -1;
      }
    }
    else {
      uVar12 = *puVar6;
    }
    pSVar1 = this->side_ + uVar10;
    pSVar11 = other_disk->side_ + uVar10;
    if (uVar12 < uVar2) {
      uVar12 = uVar2;
    }
    lVar7 = 0;
    iVar3 = 0;
    for (uVar8 = 0; (iVar3 == 0 && (uVar8 < uVar12)); uVar8 = uVar8 + 1) {
      if (exact) {
        uVar2 = *(uint *)((long)&pSVar1->tracks->size + lVar7);
        pMVar9 = pSVar11->tracks;
        if (uVar2 != *(uint *)((long)&pMVar9->size + lVar7)) {
          return -1;
        }
        __s1 = *(void **)((long)&pSVar1->tracks->bitfield + lVar7);
        if (__s1 == (void *)0x0) {
          pvVar4 = *(void **)((long)&pMVar9->bitfield + lVar7);
LAB_00155e57:
          return -(uint)(__s1 != pvVar4);
        }
        pvVar4 = *(void **)((long)&pMVar9->bitfield + lVar7);
        if (pvVar4 == (void *)0x0) {
          pvVar4 = (void *)0x0;
          goto LAB_00155e57;
        }
        iVar3 = bcmp(__s1,pvVar4,(ulong)uVar2);
        iVar3 = -(uint)(iVar3 != 0);
      }
      else {
        if (uVar8 < pSVar1->nb_tracks) {
          pMVar9 = (MFMTrack *)((long)&pSVar1->tracks->revolution + lVar7);
        }
        else {
          pMVar9 = (MFMTrack *)0x0;
        }
        if (uVar8 < pSVar11->nb_tracks) {
          track2 = (MFMTrack *)((long)&pSVar11->tracks->revolution + lVar7);
        }
        else {
          track2 = (MFMTrack *)0x0;
        }
        iVar3 = CompareTracks(this,pMVar9,track2);
        if (iVar3 == 0) {
          iVar3 = 0;
        }
        else {
          sprintf(str,"Erro track = %i",uVar8 & 0xffffffff);
        }
      }
      lVar7 = lVar7 + 0x20;
    }
    uVar10 = uVar10 + 1;
  } while( true );
}

Assistant:

int IDisk::CompareToDisk(IDisk* other_disk, bool exact)
{
   int idem = 0;

   int max_side = std::max(nb_sides_, other_disk->nb_sides_);

   for (int side = 0; side < max_side && idem == 0; side ++)
   {
      // For each side :
      if (exact && (side_[side].nb_tracks != other_disk->side_[side].nb_tracks))
      {
         return -1;
      }

      unsigned int maxTrack = std::max(side_[side].nb_tracks, other_disk->side_[side].nb_tracks);
      for (unsigned int track = 0; track < maxTrack && idem == 0; track++)
      {
         // For each track :
         // EXACT comparison ?
         if (exact)
         {
            if (side_[side].tracks[track].size != other_disk->side_[side].tracks[track].size)
            {
               return - 1;
            }
            if (side_[side].tracks[track].bitfield != nullptr && other_disk->side_[side].tracks[track].bitfield !=
               nullptr)
            {
               if (memcmp(side_[side].tracks[track].bitfield, other_disk->side_[side].tracks[track].bitfield,
                          side_[side].tracks[track].size) != 0)
               {
                  idem = -1;
               }
            }
            else
            {
               // ok if both are null
               return (side_[side].tracks[track].bitfield == other_disk->side_[side].tracks[track].bitfield) ? 0 : -1;
            }
         }
         else
         {
            // Otherwise...
            idem = CompareTracks((side_[side].nb_tracks > track) ? (&side_[side].tracks[track]) : nullptr,
                                 (other_disk->side_[side].nb_tracks > track)
                                    ? (&other_disk->side_[side].tracks[track])
                                    : nullptr);
            if (idem != 0)
            {
               char str[1024];
               sprintf(str, "Erro track = %i", track);
               //MessageBox(NULL, str, _T("Compare error"), MB_OK);
            }
         }
      }
   }

   return idem;
}